

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

CLBool * __thiscall CLBool::operator=(CLBool *this,string *other)

{
  string *in_RSI;
  CLBool *in_RDI;
  stringstream sstream;
  stringstream local_198 [16];
  ostream local_188 [376];
  string *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,local_10);
  std::istream::operator>>((istream *)local_198,(bool *)(in_RDI + 0x50));
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

CLBool& operator=(std::string& other) {
        std::stringstream sstream ;
        sstream << other ;
        sstream >> value ;
        return *this ;
    }